

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O3

Float pbrt::FBm(Point3f p,Vector3f dpdx,Vector3f dpdy,Float omega,int maxOctaves)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  float in_XMM2_Dd;
  float in_XMM4_Dd;
  float fVar16;
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 in_register_000013c4 [12];
  undefined4 local_58;
  undefined1 auVar12 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar17._4_60_ = dpdy._12_60_;
  auVar17._0_4_ = dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._4_60_ = dpdx._12_60_;
  auVar12._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.x *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar7._4_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar7._8_4_ = 0;
  auVar7._12_4_ = in_XMM2_Dd * in_XMM2_Dd;
  auVar15._0_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.x * dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar15._4_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.y * dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar15._8_4_ = 0;
  auVar15._12_4_ = in_XMM4_Dd * in_XMM4_Dd;
  auVar10 = vhaddps_avx(auVar7,auVar15);
  auVar7 = vinsertps_avx(auVar12._0_16_,auVar17._0_16_,0x10);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar8._0_4_ = auVar7._0_4_ * auVar7._0_4_ + auVar10._0_4_;
  auVar8._4_4_ = auVar7._4_4_ * auVar7._4_4_ + auVar10._4_4_;
  auVar8._8_4_ = auVar7._8_4_ * auVar7._8_4_ + auVar10._8_4_;
  auVar8._12_4_ = auVar7._12_4_ * auVar7._12_4_ + auVar10._12_4_;
  auVar10 = vmovshdup_avx(auVar8);
  auVar10 = vmaxss_avx(auVar10,auVar8);
  fVar6 = logf(auVar10._0_4_);
  auVar10._8_8_ = in_XMM0_Qb;
  auVar10._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar18 = 1.0;
  fVar16 = 1.0;
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)(fVar6 * 1.442695)),
                           ZEXT416(0xbf800000));
  auVar7 = vmovshdup_avx(auVar10);
  auVar9._0_4_ = (float)maxOctaves;
  auVar9._4_12_ = in_register_000013c4;
  auVar10 = vminss_avx(auVar9,auVar4);
  uVar1 = vcmpss_avx512f(auVar4,ZEXT816(0),1);
  fVar6 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar10._0_4_);
  auVar4._4_12_ = auVar10._4_12_;
  auVar4._0_4_ = fVar6;
  auVar10 = vroundss_avx(auVar4,auVar4,9);
  iVar2 = (int)auVar10._0_4_;
  auVar12 = ZEXT864(0) << 0x20;
  auVar10 = auVar12._0_16_;
  if (0 < iVar2) {
    fVar18 = 1.0;
    iVar3 = iVar2;
    fVar16 = fVar18;
    do {
      auVar13._0_4_ =
           Noise(p.super_Tuple3<pbrt::Point3,_float>.x * fVar16,auVar7._0_4_ * fVar16,
                 fVar16 * p.super_Tuple3<pbrt::Point3,_float>.z);
      auVar13._4_60_ = extraout_var;
      iVar3 = iVar3 + -1;
      fVar16 = fVar16 * 1.99;
      auVar10 = vfmadd231ss_fma(auVar12._0_16_,ZEXT416((uint)fVar18),auVar13._0_16_);
      fVar18 = fVar18 * omega;
      auVar12 = ZEXT1664(auVar10);
    } while (iVar3 != 0);
  }
  auVar11._0_4_ = ((fVar6 - (float)iVar2) + -0.3) / 0.39999998;
  auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
  uVar1 = vcmpss_avx512f(auVar11,ZEXT816(0) << 0x40,1);
  fVar6 = (float)((uint)!(bool)((byte)uVar1 & 1) * auVar4._0_4_);
  auVar5._4_12_ = auVar4._4_12_;
  auVar5._0_4_ = fVar6;
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar5,ZEXT416(0x40400000));
  auVar14._0_4_ =
       Noise(p.super_Tuple3<pbrt::Point3,_float>.x * fVar16,auVar7._0_4_ * fVar16,
             fVar16 * p.super_Tuple3<pbrt::Point3,_float>.z);
  auVar14._4_60_ = extraout_var_00;
  local_58 = auVar10._0_4_;
  auVar10 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)(fVar6 * fVar6 * auVar4._0_4_ * fVar18)),
                            ZEXT416(local_58));
  return auVar10._0_4_;
}

Assistant:

Float FBm(Point3f p, Vector3f dpdx, Vector3f dpdy, Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for FBm
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * Noise(lambda * p);
        lambda *= 1.99f;
        o *= omega;
    }
    Float nPartial = n - nInt;
    sum += o * SmoothStep(nPartial, .3f, .7f) * Noise(lambda * p);

    return sum;
}